

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O2

char * __thiscall QUndoModel::index(QUndoModel *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  QModelIndex *in_R8;
  
  if ((((*(long *)(__s + 0x10) != 0) && (bVar1 = QModelIndex::isValid(in_R8), !bVar1)) &&
      (in_ECX == 0)) && ((-1 < __c && (iVar2 = QUndoStack::count(), __c <= iVar2)))) {
    *(int *)this = __c;
    *(undefined4 *)&this->field_0x4 = 0;
    *(undefined8 *)&this->field_0x8 = 0;
    this->m_stack = (QUndoStack *)__s;
    return (char *)this;
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->m_stack = (QUndoStack *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QUndoModel::index(int row, int column, const QModelIndex &parent) const
{
    if (m_stack == nullptr)
        return QModelIndex();

    if (parent.isValid())
        return QModelIndex();

    if (column != 0)
        return QModelIndex();

    if (row < 0 || row > m_stack->count())
        return QModelIndex();

    return createIndex(row, column);
}